

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O3

void __thiscall crnlib::dxt_image::init_task(dxt_image *this,uint64 data,void *pData_ptr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  pack_params *p;
  crn_thread_id_t cVar5;
  long lVar6;
  bool bVar7;
  crn_thread_id_t cVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uchar *puVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  color_quad_u8 pixels [16];
  set_block_pixels_context optimizer_context;
  uint local_fb4;
  ulong local_fb0;
  uint local_f98;
  color_quad_u8 local_f78 [18];
  set_block_pixels_context local_f30;
  
  piVar4 = *(int **)((long)pData_ptr + 8);
  p = *(pack_params **)((long)pData_ptr + 0x10);
  cVar8 = crn_get_current_thread_id();
  cVar5 = *(crn_thread_id_t *)((long)pData_ptr + 0x18);
  dxt1_endpoint_optimizer::dxt1_endpoint_optimizer(&local_f30.m_dxt1_optimizer);
  dxt5_endpoint_optimizer::dxt5_endpoint_optimizer(&local_f30.m_dxt5_optimizer);
  local_f30.m_etc1_optimizer.m_optimizer.m_best_solution.m_selectors.m_p = (uchar *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_solution.m_selectors.m_size = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_solution.m_selectors.m_capacity = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_luma.m_p = (unsigned_short *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_luma.m_size = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_luma.m_capacity = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_sorted_luma[0].m_p = (uint *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_sorted_luma[0].m_size = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_sorted_luma[0].m_capacity = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_sorted_luma[1].m_p = (uint *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_sorted_luma[1].m_size = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_sorted_luma[1].m_capacity = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_selectors.m_p = (uchar *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_selectors.m_size = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_selectors.m_capacity = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_selectors.m_p = (uchar *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_selectors.m_size._0_1_ = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_selectors._9_7_ = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.r
       = '\0';
  local_f30.m_etc1_optimizer.m_optimizer.m_best_solution.m_coords._1_8_ = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_solution.m_error = 0xffffffffffffffff;
  uVar17 = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_solution.m_valid = false;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_coords.m_color4 = false;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_coords.m_unscaled_color.field_0 =
       (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_coords.m_inten_table = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_selectors.m_p = (uchar *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_selectors.m_size = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_selectors.m_capacity = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_error = 0xffffffffffffffff;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_valid = false;
  local_f30.m_etc1_optimizer.m_optimizer.m_temp_selectors.m_p = (uchar *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_temp_selectors.m_size = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_temp_selectors.m_capacity = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_pParams = (params *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_pResult = (results *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_pSorted_luma_indices = (uint32 *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_pSorted_luma = (uint32 *)0x0;
  uVar9 = this->m_blocks_y;
  if (uVar9 != 0) {
    uVar10 = (ulong)this->m_blocks_x;
    local_fb4 = 0xffffffff;
    local_fb0 = 0;
    do {
      if ((int)uVar10 == 0) {
        uVar10 = 0;
      }
      else {
        iVar18 = 0;
        uVar12 = 0;
        do {
          if (*(long *)((long)pData_ptr + 0x20) != 0) goto LAB_00192430;
          if ((((p->m_pProgress_callback != (progress_callback_func)0x0) && (cVar8 == cVar5)) &&
              ((uVar17 & 0x3f) == 0x3f)) &&
             ((uVar9 = (int)uVar10 * this->m_blocks_y,
              uVar11 = ((uVar9 >> 1) + p->m_progress_range * uVar17) / uVar9 + p->m_progress_start,
              uVar11 != local_fb4 &&
              (bVar7 = (*p->m_pProgress_callback)(uVar11,p->m_pProgress_callback_user_data_ptr),
              local_fb4 = uVar11, !bVar7)))) {
            LOCK();
            *(undefined8 *)((long)pData_ptr + 0x20) = 1;
            UNLOCK();
            goto LAB_00192430;
          }
          if ((p->m_num_helper_threads == 0) ||
             (local_f98 = (uint)data, uVar17 % (p->m_num_helper_threads + 1) == local_f98)) {
            iVar1 = *piVar4;
            iVar2 = piVar4[1];
            lVar6 = *(long *)(piVar4 + 6);
            iVar3 = piVar4[2];
            puVar13 = &local_f78[0].field_0.field_0.a;
            lVar14 = 0;
            do {
              uVar9 = (int)lVar14 + (uint)local_fb0 * 4;
              if (iVar2 - 1U <= uVar9) {
                uVar9 = iVar2 - 1U;
              }
              lVar15 = 0;
              do {
                uVar16 = iVar18 + (int)lVar15;
                if (iVar1 - 1U <= uVar16) {
                  uVar16 = iVar1 - 1U;
                }
                uVar10 = (ulong)(uVar16 + uVar9 * iVar3);
                puVar13[lVar15 * 4 + -3] = *(uchar *)(lVar6 + uVar10 * 4);
                puVar13[lVar15 * 4 + -2] = *(uchar *)(lVar6 + 1 + uVar10 * 4);
                puVar13[lVar15 * 4 + -1] = *(uchar *)(lVar6 + 2 + uVar10 * 4);
                puVar13[lVar15 * 4] = *(uchar *)(lVar6 + 3 + uVar10 * 4);
                lVar15 = lVar15 + 1;
              } while (lVar15 != 4);
              lVar14 = lVar14 + 1;
              puVar13 = puVar13 + 0x10;
            } while (lVar14 != 4);
            set_block_pixels(this,(uint)uVar12,(uint)local_fb0,local_f78,p,&local_f30);
          }
          uVar12 = uVar12 + 1;
          uVar17 = uVar17 + 1;
          uVar10 = (ulong)this->m_blocks_x;
          iVar18 = iVar18 + 4;
        } while (uVar12 < uVar10);
        uVar9 = this->m_blocks_y;
      }
      local_fb0 = local_fb0 + 1;
    } while (local_fb0 < uVar9);
  }
LAB_00192430:
  etc1_optimizer::~etc1_optimizer(&local_f30.m_etc1_optimizer.m_optimizer);
  dxt5_endpoint_optimizer::~dxt5_endpoint_optimizer(&local_f30.m_dxt5_optimizer);
  dxt1_endpoint_optimizer::~dxt1_endpoint_optimizer(&local_f30.m_dxt1_optimizer);
  return;
}

Assistant:

void dxt_image::init_task(uint64 data, void* pData_ptr) {
  const uint thread_index = static_cast<uint>(data);
  init_task_params* pInit_params = static_cast<init_task_params*>(pData_ptr);

  const image_u8& img = *pInit_params->m_pImg;
  const pack_params& p = *pInit_params->m_pParams;
  const bool is_main_thread = (crn_get_current_thread_id() == pInit_params->m_main_thread);

  uint block_index = 0;

  set_block_pixels_context optimizer_context;
  int prev_progress_percentage = -1;

  for (uint block_y = 0; block_y < m_blocks_y; block_y++) {
    const uint pixel_ofs_y = block_y * cDXTBlockSize;

    for (uint block_x = 0; block_x < m_blocks_x; block_x++, block_index++) {
      if (pInit_params->m_canceled)
        return;

      if (p.m_pProgress_callback && is_main_thread && ((block_index & 63) == 63)) {
        const uint progress_percentage = p.m_progress_start + ((block_index * p.m_progress_range + get_total_blocks() / 2) / get_total_blocks());
        if ((int)progress_percentage != prev_progress_percentage) {
          prev_progress_percentage = progress_percentage;
          if (!(p.m_pProgress_callback)(progress_percentage, p.m_pProgress_callback_user_data_ptr)) {
            atomic_exchange32(&pInit_params->m_canceled, CRNLIB_TRUE);
            return;
          }
        }
      }

      if (p.m_num_helper_threads) {
        if ((block_index % (p.m_num_helper_threads + 1)) != thread_index)
          continue;
      }

      color_quad_u8 pixels[cDXTBlockSize * cDXTBlockSize];

      const uint pixel_ofs_x = block_x * cDXTBlockSize;

      for (uint y = 0; y < cDXTBlockSize; y++) {
        const uint iy = math::minimum(pixel_ofs_y + y, img.get_height() - 1);

        for (uint x = 0; x < cDXTBlockSize; x++) {
          const uint ix = math::minimum(pixel_ofs_x + x, img.get_width() - 1);

          pixels[x + y * cDXTBlockSize] = img(ix, iy);
        }
      }

      set_block_pixels(block_x, block_y, pixels, p, optimizer_context);
    }
  }
}